

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Store::Collect(Store *this)

{
  ObjectList *this_00;
  Object *pOVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  bool bVar5;
  Ref *pRVar6;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar7;
  size_type __n;
  bool bVar8;
  Index i;
  ulong index;
  size_type __new_size;
  size_t i_1;
  Index index_00;
  reference rVar9;
  _Bit_iterator __last;
  _Bit_iterator __first;
  vector<bool,_std::allocator<bool>_> all_marked;
  allocator_type local_62;
  bool local_61;
  vector<bool,_std::allocator<bool>_> *local_60;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  this_00 = &this->objects_;
  __new_size = (long)(this->objects_).list_.
                     super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->objects_).list_.
                     super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_60 = &this->marks_;
  std::vector<bool,_std::allocator<bool>_>::resize(local_60,__new_size,false);
  p_Var4 = &(this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar3;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  std::__fill_a1(__first,__last,(bool *)&local_58);
  for (index = 0;
      index < (ulong)((long)(this->roots_).list_.
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->roots_).list_.
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); index = index + 1) {
    bVar5 = FreeList<wabt::interp::Ref>::IsUsed(&this->roots_,index);
    if (bVar5) {
      pRVar6 = FreeList<wabt::interp::Ref>::Get(&this->roots_,index);
      Mark(this,(Ref)pRVar6->index);
    }
  }
  local_61 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,__new_size,&local_61,&local_62);
  __n = 0;
  bVar5 = false;
  do {
    for (; bVar8 = bVar5, __n != __new_size; __n = __n + 1) {
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
      if ((*rVar9._M_p & rVar9._M_mask) == 0) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](local_60,__n);
        if ((*rVar9._M_p & rVar9._M_mask) != 0) {
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
          *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
          puVar7 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
                   ::Get(this_00,__n);
          pOVar1 = (puVar7->_M_t).
                   super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                   .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
          (*pOVar1->_vptr_Object[2])(pOVar1,this);
          bVar8 = true;
        }
      }
      bVar5 = bVar8;
    }
    __n = 0;
    bVar5 = false;
  } while (bVar8);
  for (index_00 = 0; __new_size != index_00; index_00 = index_00 + 1) {
    bVar5 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
            ::IsUsed(this_00,index_00);
    if (bVar5) {
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&local_58,index_00);
      if ((*rVar9._M_p & rVar9._M_mask) == 0) {
        FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
        ::Delete(this_00,index_00);
      }
    }
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate(&local_58);
  return;
}

Assistant:

void Store::Collect() {
  size_t object_count = objects_.size();
  marks_.resize(object_count);
  std::fill(marks_.begin(), marks_.end(), false);

  // First mark all roots.
  for (RootList::Index i = 0; i < roots_.size(); ++i) {
    if (roots_.IsUsed(i)) {
      Mark(roots_.Get(i));
    }
  }

  // TODO: better GC algo.
  // Loop through all newly marked objects and mark their referents.
  std::vector<bool> all_marked(object_count, false);
  bool new_marked;
  do {
    new_marked = false;
    for (size_t i = 0; i < object_count; ++i) {
      if (!all_marked[i] && marks_[i]) {
        all_marked[i] = true;
        objects_.Get(i)->Mark(*this);
        new_marked = true;
      }
    }
  } while (new_marked);

  // Delete all unmarked objects.
  for (size_t i = 0; i < object_count; ++i) {
    if (objects_.IsUsed(i) && !all_marked[i]) {
      objects_.Delete(i);
    }
  }
}